

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int isolat1ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  bool bVar10;
  
  iVar6 = (int)out;
  iVar4 = (int)in;
  iVar3 = -1;
  if ((((inlen != (int *)0x0) && (outlen != (int *)0x0)) && (out != (uchar *)0x0)) &&
     (in != (uchar *)0x0)) {
    pbVar1 = out + *outlen;
    bVar10 = 0 < (long)*inlen;
    pbVar8 = out + (long)*outlen + -1;
    if (out < pbVar8 && bVar10) {
      pbVar7 = in + *inlen;
      pbVar5 = pbVar7;
      do {
        if ((char)*in < '\0') {
          *out = *in >> 6 | 0xc0;
          out[1] = *in & 0x3f | 0x80;
          out = out + 2;
          in = in + 1;
        }
        lVar9 = (long)pbVar1 - (long)out;
        if (lVar9 < (long)pbVar5 - (long)in) {
          pbVar5 = in + lVar9;
        }
        if (in < pbVar5) {
          lVar9 = (long)pbVar5 - (long)in;
          do {
            bVar2 = *in;
            if ((char)bVar2 < '\0') break;
            in = in + 1;
            *out = bVar2;
            out = out + 1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        bVar10 = in < pbVar7;
      } while ((bVar10) && (out < pbVar8));
    }
    if ((bVar10) && ((out < pbVar1 && (bVar2 = *in, -1 < (char)bVar2)))) {
      in = in + 1;
      *out = bVar2;
      out = out + 1;
    }
    *outlen = (int)out - iVar6;
    *inlen = (int)in - iVar4;
    iVar3 = *outlen;
  }
  return iVar3;
}

Assistant:

int
isolat1ToUTF8(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend;
    const unsigned char* inend;
    const unsigned char* instop;

    if ((out == NULL) || (in == NULL) || (outlen == NULL) || (inlen == NULL))
	return(-1);

    outend = out + *outlen;
    inend = in + (*inlen);
    instop = inend;

    while ((in < inend) && (out < outend - 1)) {
	if (*in >= 0x80) {
	    *out++ = (((*in) >>  6) & 0x1F) | 0xC0;
            *out++ = ((*in) & 0x3F) | 0x80;
	    ++in;
	}
	if ((instop - in) > (outend - out)) instop = in + (outend - out);
	while ((in < instop) && (*in < 0x80)) {
	    *out++ = *in++;
	}
    }
    if ((in < inend) && (out < outend) && (*in < 0x80)) {
        *out++ = *in++;
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(*outlen);
}